

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_serial_posix.c
# Opt level: O0

int platform_serial_get_modem_status(int fd)

{
  uint local_14;
  uint local_10;
  int retstatus;
  int status;
  int fd_local;
  
  local_10 = 0;
  local_14 = 0;
  retstatus = fd;
  ioctl(fd,0x5415,&local_10);
  if ((local_10 & 0x20) != 0) {
    local_14 = 0x10;
  }
  if ((local_10 & 0x100) != 0) {
    local_14 = local_14 | 0x20;
  }
  if ((local_10 & 0x80) != 0) {
    local_14 = local_14 | 0x40;
  }
  if ((local_10 & 0x40) != 0) {
    local_14 = local_14 | 0x80;
  }
  return local_14;
}

Assistant:

int platform_serial_get_modem_status(int fd) {
    int status = 0;
    int retstatus = 0;

    ioctl(fd, TIOCMGET, &status);

    if (status & TIOCM_CTS) {
        retstatus |= 0x0010;
    }

    if (status & TIOCM_DSR) {
        retstatus |= 0x0020;
    }

    if (status & TIOCM_RNG) {
        retstatus |= 0x0040;
    }

    if (status & TIOCM_CAR) {
        retstatus |= 0x0080;
    }

    return retstatus;
}